

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRString * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::
allocate<diligent_spirv_cross::SPIRString&>
          (ObjectPool<diligent_spirv_cross::SPIRString> *this,SPIRString *p)

{
  Vector<diligent_spirv_cross::SPIRString_*> *this_00;
  pointer pcVar1;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRString_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
  _Var2;
  size_t sVar3;
  ulong count;
  _Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false> _Var4;
  SPIRString *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>)malloc(count * 0x30);
    if (_Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl ==
        (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
      _Var4._M_head_impl =
           (SPIRString *)
           _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl;
      do {
        SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.ptr[sVar3] =
             _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRString_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
    .super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false> =
         _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_007ba558;
  }
  else {
    pSVar5 = (this_00->super_VectorView<diligent_spirv_cross::SPIRString_*>).ptr[sVar3 - 1];
  }
  SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_007ba558:
  (pSVar5->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_00b5e4a0;
  (pSVar5->str)._M_dataplus._M_p = (pointer)&(pSVar5->str).field_2;
  pcVar1 = (p->str)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar5->str,pcVar1,pcVar1 + (p->str)._M_string_length);
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}